

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,uint w,
                    uint h,LodePNGColorType colortype,uint bitdepth)

{
  const_iterator __position;
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_00000214;
  uint in_stack_00000218;
  uint in_stack_0000021c;
  uchar *in_stack_00000220;
  size_t *in_stack_00000228;
  uchar **in_stack_00000230;
  uint in_stack_00000240;
  undefined4 in_stack_ffffffffffffff9c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  uVar2 = in_R9D;
  uVar1 = lodepng_encode_memory
                    (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_0000021c,
                     in_stack_00000218,in_stack_00000214,in_stack_00000240);
  if (in_stack_ffffffffffffffd8 != (uchar *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_R9D));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_R9D));
    __position._M_current._4_4_ = in_EDX;
    __position._M_current._0_4_ = in_ECX;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(in_R8D,uVar2),
               __position,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    lodepng_free((void *)0x1cd4aa);
  }
  return uVar1;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out, const unsigned char* in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, in, w, h, colortype, bitdepth);
  if(buffer) {
    out.insert(out.end(), buffer, &buffer[buffersize]);
    lodepng_free(buffer);
  }
  return error;
}